

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::inputMethodEvent(QTextEdit *this,QInputMethodEvent *e)

{
  bool bVar1;
  QInputMethodEvent *in_RSI;
  QEvent *unaff_retaddr;
  QTextEditPrivate *in_stack_00000008;
  bool emptyEvent;
  QTextEditPrivate *d;
  uint6 in_stack_ffffffffffffffe0;
  bool bVar2;
  
  d_func((QTextEdit *)0x6d43b0);
  QTextEditPrivate::sendControlEvent(in_stack_00000008,unaff_retaddr);
  QInputMethodEvent::preeditString(in_RSI);
  bVar1 = QString::isEmpty((QString *)0x6d43d6);
  bVar2 = false;
  if (bVar1) {
    QInputMethodEvent::commitString(in_RSI);
    bVar1 = QString::isEmpty((QString *)0x6d43f7);
    bVar2 = false;
    if (bVar1) {
      QInputMethodEvent::attributes(in_RSI);
      bVar2 = QList<QInputMethodEvent::Attribute>::isEmpty
                        ((QList<QInputMethodEvent::Attribute> *)0x6d4418);
    }
  }
  if (bVar2 == false) {
    ensureCursorVisible((QTextEdit *)(ulong)in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void QTextEdit::inputMethodEvent(QInputMethodEvent *e)
{
    Q_D(QTextEdit);
#ifdef QT_KEYPAD_NAVIGATION
    if (d->control->textInteractionFlags() & Qt::TextEditable
        && QApplicationPrivate::keypadNavigationEnabled()
        && !hasEditFocus())
        setEditFocus(true);
#endif
    d->sendControlEvent(e);
    const bool emptyEvent = e->preeditString().isEmpty() && e->commitString().isEmpty()
                         && e->attributes().isEmpty();
    if (emptyEvent)
        return;
    ensureCursorVisible();
}